

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::FormalArgumentSymbol::serializeTo(FormalArgumentSymbol *this,ASTSerializer *serializer)

{
  Expression *__n;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view sVar1;
  FormalArgumentSymbol *in_stack_00000018;
  Expression *defVal;
  ASTSerializer *this_00;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  sVar1 = ast::toString(In);
  local_30 = sVar1._M_len;
  ASTSerializer::write(this_00,local_20,local_18,local_30);
  __n = getDefaultValue(in_stack_00000018);
  if (__n != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)this_00)
    ;
    ASTSerializer::write(in_RSI,local_48,local_40,(size_t)__n);
  }
  return;
}

Assistant:

void FormalArgumentSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));
    if (auto defVal = getDefaultValue())
        serializer.write("defaultValue", *defVal);
}